

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::ub::StructType::addMember(StructType *this,char *name,VarType *type,deUint32 flags)

{
  StructMember local_50;
  
  StructMember::StructMember(&local_50,name,type,flags);
  std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>::
  emplace_back<deqp::gls::ub::StructMember>(&this->m_members,&local_50);
  ub::VarType::~VarType(&local_50.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_name._M_dataplus._M_p != &local_50.m_name.field_2) {
    operator_delete(local_50.m_name._M_dataplus._M_p,
                    local_50.m_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void StructType::addMember (const char* name, const VarType& type, deUint32 flags)
{
	m_members.push_back(StructMember(name, type, flags));
}